

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O0

int Abc_StringGetNumber(char **ppStr)

{
  bool bVar1;
  int local_1c;
  char *pcStack_18;
  int Number;
  char *pStr;
  char **ppStr_local;
  
  pcStack_18 = *ppStr;
  local_1c = 0;
  if (('/' < *pcStack_18) && (*pcStack_18 < ':')) {
    while( true ) {
      bVar1 = false;
      if ('/' < *pcStack_18) {
        bVar1 = *pcStack_18 < ':';
      }
      if (!bVar1) break;
      local_1c = local_1c * 10 + (int)*pcStack_18 + -0x30;
      pcStack_18 = pcStack_18 + 1;
    }
    *ppStr = pcStack_18;
    return local_1c;
  }
  __assert_fail("*pStr >= \'0\' && *pStr <= \'9\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBlifMv.c"
                ,0x7d,"int Abc_StringGetNumber(char **)");
}

Assistant:

static inline int Abc_StringGetNumber( char ** ppStr )
{
    char * pStr = *ppStr;
    int Number = 0;
    assert( *pStr >= '0' && *pStr <= '9' );
    for ( ; *pStr >= '0' && *pStr <= '9'; pStr++ )
        Number = 10 * Number + *pStr - '0';
    *ppStr = pStr;
    return Number;
}